

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int tcmalloc_backtrace_uncompress_zdebug
              (backtrace_state *state,uchar *compressed,size_t compressed_size,
              backtrace_error_callback error_callback,void *data,uchar **uncompressed,
              size_t *uncompressed_size)

{
  uint16_t *zdebug_table_00;
  int ret;
  uint16_t *zdebug_table;
  uchar **uncompressed_local;
  void *data_local;
  backtrace_error_callback error_callback_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  backtrace_state *state_local;
  
  zdebug_table_00 = (uint16_t *)tcmalloc_backtrace_alloc(state,0x4000,error_callback,data);
  if (zdebug_table_00 == (uint16_t *)0x0) {
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ =
         elf_uncompress_zdebug
                   (state,compressed,compressed_size,zdebug_table_00,error_callback,data,
                    uncompressed,uncompressed_size);
    tcmalloc_backtrace_free(state,zdebug_table_00,0x4000,error_callback,data);
  }
  return state_local._4_4_;
}

Assistant:

int
backtrace_uncompress_zdebug (struct backtrace_state *state,
			     const unsigned char *compressed,
			     size_t compressed_size,
			     backtrace_error_callback error_callback,
			     void *data, unsigned char **uncompressed,
			     size_t *uncompressed_size)
{
  uint16_t *zdebug_table;
  int ret;

  zdebug_table = ((uint16_t *) backtrace_alloc (state, ZDEBUG_TABLE_SIZE,
						error_callback, data));
  if (zdebug_table == NULL)
    return 0;
  ret = elf_uncompress_zdebug (state, compressed, compressed_size,
			       zdebug_table, error_callback, data,
			       uncompressed, uncompressed_size);
  backtrace_free (state, zdebug_table, ZDEBUG_TABLE_SIZE,
		  error_callback, data);
  return ret;
}